

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_load.cpp
# Opt level: O3

string * duckdb::FilterZeroAtEnd(string *__return_storage_ptr__,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  string *psVar4;
  
  psVar4 = (string *)s->_M_string_length;
  while (psVar4 != (string *)0x0) {
    if (((s->_M_dataplus)._M_p + -1)[(long)psVar4] != '\0') goto LAB_00f648ab;
    ::std::__cxx11::string::pop_back();
    psVar4 = (string *)s->_M_string_length;
  }
  psVar4 = (string *)0x0;
LAB_00f648ab:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (s->_M_dataplus)._M_p;
  paVar1 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&s->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = (size_type)psVar4;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  return psVar4;
}

Assistant:

static string FilterZeroAtEnd(string s) {
	while (!s.empty() && s.back() == '\0') {
		s.pop_back();
	}
	return s;
}